

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

void __thiscall
helics::RerouteFilterOperation::setString
          (RerouteFilterOperation *this,string_view property,string_view val)

{
  long *plVar1;
  handle cond;
  regex test;
  unique_lock<std::shared_mutex> local_68;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = val._M_str;
  local_30._M_len = val._M_len;
  plVar1 = (long *)property._M_str;
  if (property._M_len == 9) {
    if ((char)plVar1[1] == 'n' && *plVar1 == 0x6f697469646e6f63) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,local_30._M_str,local_30._M_len,0x10);
      local_68._M_device = &(this->conditions).m_mutex;
      local_68._M_owns = false;
      std::unique_lock<std::shared_mutex>::lock(&local_68);
      local_68._M_owns = true;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->conditions,&local_30);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_68);
      CLI::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_50);
    }
  }
  else if ((property._M_len == 0xe) &&
          (*(long *)((long)plVar1 + 6) == 0x6e6f6974616e6974 && *plVar1 == 0x697473656477656e)) {
    gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
              ((atomic_guarded<std::__cxx11::string,std::mutex> *)&this->newDest,&local_30);
  }
  return;
}

Assistant:

void RerouteFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "newdestination") {
        newDest = val;
    } else if (property == "condition") {
        try {
            // this line is to verify that it is a valid regex
            auto test = std::regex(val.data(), val.size());
            auto cond = conditions.lock();
            cond->emplace(val);
        }
        catch (const std::regex_error& re) {
            std::cerr << "filter expression is not a valid Regular expression " << re.what()
                      << '\n';
            throw(helics::InvalidParameter(
                std::string("filter expression is not a valid Regular expression ") + re.what()));
        }
    }
}